

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void updateVirtualTable(Parse *pParse,SrcList *pSrc,Table *pTab,ExprList *pChanges,Expr *pRowid,
                       int *aXRef,Expr *pWhere,int onError)

{
  u8 uVar1;
  short sVar2;
  int p1;
  int iVar3;
  Vdbe *p;
  int p2;
  int addr;
  WhereInfo *pWInfo;
  Parse *pPVar4;
  int p2_00;
  int p2_01;
  Op *pOVar5;
  int iVar6;
  long lVar7;
  VTable *zP4;
  int iVar8;
  int p2_02;
  
  p = pParse->pVdbe;
  zP4 = pTab->pVTable;
  if (zP4 != (VTable *)0x0) {
    do {
      if (zP4->db == pParse->db) break;
      zP4 = zP4->pNext;
    } while (zP4 != (VTable *)0x0);
  }
  sVar2 = pTab->nCol;
  iVar8 = (int)sVar2;
  p2_00 = iVar8 + 2;
  iVar6 = pSrc->a[0].iCursor;
  p1 = pParse->nTab;
  pParse->nTab = p1 + 1;
  addr = sqlite3VdbeAddOp3(p,0x6b,p1,p2_00,0);
  iVar3 = pParse->nMem;
  p2_02 = iVar3 + 4 + iVar8;
  pParse->nMem = p2_02;
  pWInfo = sqlite3WhereBegin(pParse,pSrc,pWhere,(ExprList *)0x0,(ExprList *)0x0,4,0);
  if (pWInfo == (WhereInfo *)0x0) {
    return;
  }
  p2_01 = iVar3 + 1;
  sqlite3VdbeAddOp3(p,0x7a,iVar6,p2_01,0);
  if (pRowid == (Expr *)0x0) {
    sqlite3VdbeAddOp3(p,0x7a,iVar6,iVar3 + 2,0);
  }
  else {
    sqlite3ExprCode(pParse,pRowid,iVar3 + 2);
  }
  if (0 < pTab->nCol) {
    lVar7 = 0;
    do {
      p2 = (int)lVar7;
      if ((long)aXRef[lVar7] < 0) {
        sqlite3VdbeAddOp3(p,0x9b,iVar6,p2,iVar3 + 3 + p2);
      }
      else {
        sqlite3ExprCode(pParse,pChanges->a[aXRef[lVar7]].pExpr,iVar3 + 3 + p2);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pTab->nCol);
  }
  uVar1 = pWInfo->eOnePass;
  if (uVar1 == '\0') {
    iVar6 = iVar3 + iVar8 + 3;
    sqlite3VdbeAddOp3(p,99,p2_01,p2_00,iVar6);
    sqlite3VdbeAddOp3(p,0x72,p1,p2_02,0);
    sqlite3VdbeAddOp3(p,0x73,p1,iVar6,p2_02);
  }
  else {
    sqlite3VdbeChangeToNoop(p,addr);
    if (pParse->pToplevel == (Parse *)0x0) {
      pParse->isMultiWrite = '\0';
    }
  }
  if (uVar1 == '\0') {
    sqlite3WhereEnd(pWInfo);
    iVar6 = 0;
    addr = sqlite3VdbeAddOp3(p,0x39,p1,0,0);
    if (-2 < sVar2) {
      do {
        sqlite3VdbeAddOp3(p,0x60,p1,iVar6,p2_01 + iVar6);
        iVar6 = iVar6 + 1;
      } while (p2_00 != iVar6);
    }
  }
  sqlite3VtabMakeWritable(pParse,pTab);
  iVar6 = sqlite3VdbeAddOp3(p,0xc,0,p2_00,p2_01);
  sqlite3VdbeChangeP4(p,iVar6,(char *)zP4,-8);
  if (0 < (long)p->nOp) {
    iVar6 = 2;
    if (onError != 10) {
      iVar6 = onError;
    }
    p->aOp[(long)p->nOp + -1].p5 = (u16)iVar6;
  }
  pPVar4 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar4 = pParse;
  }
  pPVar4->mayAbort = '\x01';
  if (uVar1 == '\0') {
    sqlite3VdbeAddOp3(p,7,p1,addr + 1,0);
    if (p->db->mallocFailed == '\0') {
      iVar6 = p->nOp + -1;
      if (-1 < addr) {
        iVar6 = addr;
      }
      pOVar5 = p->aOp + iVar6;
    }
    else {
      pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar5->p2 = p->nOp;
    sqlite3VdbeAddOp3(p,0x6f,p1,0,0);
    return;
  }
  sqlite3WhereEnd(pWInfo);
  return;
}

Assistant:

static void updateVirtualTable(
  Parse *pParse,       /* The parsing context */
  SrcList *pSrc,       /* The virtual table to be modified */
  Table *pTab,         /* The virtual table */
  ExprList *pChanges,  /* The columns to change in the UPDATE statement */
  Expr *pRowid,        /* Expression used to recompute the rowid */
  int *aXRef,          /* Mapping from columns of pTab to entries in pChanges */
  Expr *pWhere,        /* WHERE clause of the UPDATE statement */
  int onError          /* ON CONFLICT strategy */
){
  Vdbe *v = pParse->pVdbe;  /* Virtual machine under construction */
  int ephemTab;             /* Table holding the result of the SELECT */
  int i;                    /* Loop counter */
  sqlite3 *db = pParse->db; /* Database connection */
  const char *pVTab = (const char*)sqlite3GetVTable(db, pTab);
  WhereInfo *pWInfo;
  int nArg = 2 + pTab->nCol;      /* Number of arguments to VUpdate */
  int regArg;                     /* First register in VUpdate arg array */
  int regRec;                     /* Register in which to assemble record */
  int regRowid;                   /* Register for ephem table rowid */
  int iCsr = pSrc->a[0].iCursor;  /* Cursor used for virtual table scan */
  int aDummy[2];                  /* Unused arg for sqlite3WhereOkOnePass() */
  int bOnePass;                   /* True to use onepass strategy */
  int addr;                       /* Address of OP_OpenEphemeral */

  /* Allocate nArg registers to martial the arguments to VUpdate. Then
  ** create and open the ephemeral table in which the records created from
  ** these arguments will be temporarily stored. */
  assert( v );
  ephemTab = pParse->nTab++;
  addr= sqlite3VdbeAddOp2(v, OP_OpenEphemeral, ephemTab, nArg);
  regArg = pParse->nMem + 1;
  pParse->nMem += nArg;
  regRec = ++pParse->nMem;
  regRowid = ++pParse->nMem;

  /* Start scanning the virtual table */
  pWInfo = sqlite3WhereBegin(pParse, pSrc, pWhere, 0,0,WHERE_ONEPASS_DESIRED,0);
  if( pWInfo==0 ) return;

  /* Populate the argument registers. */
  sqlite3VdbeAddOp2(v, OP_Rowid, iCsr, regArg);
  if( pRowid ){
    sqlite3ExprCode(pParse, pRowid, regArg+1);
  }else{
    sqlite3VdbeAddOp2(v, OP_Rowid, iCsr, regArg+1);
  }
  for(i=0; i<pTab->nCol; i++){
    if( aXRef[i]>=0 ){
      sqlite3ExprCode(pParse, pChanges->a[aXRef[i]].pExpr, regArg+2+i);
    }else{
      sqlite3VdbeAddOp3(v, OP_VColumn, iCsr, i, regArg+2+i);
    }
  }

  bOnePass = sqlite3WhereOkOnePass(pWInfo, aDummy);

  if( bOnePass ){
    /* If using the onepass strategy, no-op out the OP_OpenEphemeral coded
    ** above. Also, if this is a top-level parse (not a trigger), clear the
    ** multi-write flag so that the VM does not open a statement journal */
    sqlite3VdbeChangeToNoop(v, addr);
    if( sqlite3IsToplevel(pParse) ){
      pParse->isMultiWrite = 0;
    }
  }else{
    /* Create a record from the argument register contents and insert it into
    ** the ephemeral table. */
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regArg, nArg, regRec);
    sqlite3VdbeAddOp2(v, OP_NewRowid, ephemTab, regRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, ephemTab, regRec, regRowid);
  }


  if( bOnePass==0 ){
    /* End the virtual table scan */
    sqlite3WhereEnd(pWInfo);

    /* Begin scannning through the ephemeral table. */
    addr = sqlite3VdbeAddOp1(v, OP_Rewind, ephemTab); VdbeCoverage(v);

    /* Extract arguments from the current row of the ephemeral table and 
    ** invoke the VUpdate method.  */
    for(i=0; i<nArg; i++){
      sqlite3VdbeAddOp3(v, OP_Column, ephemTab, i, regArg+i);
    }
  }
  sqlite3VtabMakeWritable(pParse, pTab);
  sqlite3VdbeAddOp4(v, OP_VUpdate, 0, nArg, regArg, pVTab, P4_VTAB);
  sqlite3VdbeChangeP5(v, onError==OE_Default ? OE_Abort : onError);
  sqlite3MayAbort(pParse);

  /* End of the ephemeral table scan. Or, if using the onepass strategy,
  ** jump to here if the scan visited zero rows. */
  if( bOnePass==0 ){
    sqlite3VdbeAddOp2(v, OP_Next, ephemTab, addr+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr);
    sqlite3VdbeAddOp2(v, OP_Close, ephemTab, 0);
  }else{
    sqlite3WhereEnd(pWInfo);
  }
}